

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

Literal * fromBinaryenLiteral(BinaryenLiteral x)

{
  bool bVar1;
  BasicType BVar2;
  BasicHeapType BVar3;
  Literal *in_RDI;
  ulong in_stack_00000008;
  string_view local_48;
  undefined1 local_38 [8];
  HeapType heapType;
  Type local_20;
  Type type;
  
  if (6 < in_stack_00000008) {
switchD_00750c91_default:
    bVar1 = wasm::Type::isRef(&local_20);
    if (!bVar1) {
      __assert_fail("type.isRef()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                    ,0x82,"Literal fromBinaryenLiteral(BinaryenLiteral)");
    }
    local_38 = (undefined1  [8])wasm::Type::getHeapType(&local_20);
    if ((ulong)local_38 < 0xe) {
      BVar3 = wasm::HeapType::getBasic((HeapType *)local_38);
      switch(BVar3) {
      case ext:
      case any:
        wasm::handle_unreachable
                  ("TODO: extern literals",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                   ,0x8a);
      case func:
      case eq:
      case struct_:
      case array:
        wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                   ,0x8f);
      case i31:
        wasm::handle_unreachable
                  ("TODO: i31",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                   ,0x87);
      case string:
      case stringview_wtf8:
      case stringview_wtf16:
      case stringview_iter:
        wasm::handle_unreachable
                  ("TODO: string literals",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                   ,0x94);
      case none:
      case noext:
      case nofunc:
        bVar1 = wasm::Type::isNullable(&local_20);
        if (bVar1) {
          wasm::Literal::makeNull(in_RDI,(HeapType)local_38);
          return in_RDI;
        }
        __assert_fail("type.isNullable()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                      ,0x98,"Literal fromBinaryenLiteral(BinaryenLiteral)");
      }
    }
    bVar1 = wasm::HeapType::isSignature((HeapType *)local_38);
    if (bVar1) {
      wasm::Name::Name((Name *)&local_48,(char *)CONCAT44(x.type._4_4_,(int32_t)x.type));
      wasm::Literal::Literal(in_RDI,(Name)local_48,(HeapType)local_38);
      return in_RDI;
    }
    bVar1 = wasm::HeapType::isData((HeapType *)local_38);
    if (bVar1) {
      wasm::handle_unreachable
                ("TODO: gc data",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                 ,0xa0);
    }
    __assert_fail("heapType.isData()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x9f,"Literal fromBinaryenLiteral(BinaryenLiteral)");
  }
  BVar2 = wasm::Type::getBasic(&local_20);
  switch(BVar2) {
  case none:
  case unreachable:
    wasm::handle_unreachable
              ("unexpected type",
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
               ,0x7f);
  case i32:
    (in_RDI->field_0).i32 = (int32_t)x.type;
    (in_RDI->type).id = 2;
    break;
  case i64:
    (in_RDI->field_0).i64 = CONCAT44(x.type._4_4_,(int32_t)x.type);
    (in_RDI->type).id = 3;
    break;
  case f32:
    local_38._0_4_ = (int32_t)x.type;
    wasm::Literal::castToF32(in_RDI,(Literal *)local_38);
    goto LAB_00750d9b;
  case f64:
    local_38 = (undefined1  [8])CONCAT44(x.type._4_4_,(int32_t)x.type);
    wasm::Literal::castToF64(in_RDI,(Literal *)local_38);
LAB_00750d9b:
    wasm::Literal::~Literal((Literal *)local_38);
    break;
  case v128:
    wasm::Literal::Literal(in_RDI,(uint8_t *)&x);
    break;
  default:
    goto switchD_00750c91_default;
  }
  return in_RDI;
}

Assistant:

Literal fromBinaryenLiteral(BinaryenLiteral x) {
  auto type = Type(x.type);
  if (type.isBasic()) {
    switch (type.getBasic()) {
      case Type::i32:
        return Literal(x.i32);
      case Type::i64:
        return Literal(x.i64);
      case Type::f32:
        return Literal(x.i32).castToF32();
      case Type::f64:
        return Literal(x.i64).castToF64();
      case Type::v128:
        return Literal(x.v128);
      case Type::none:
      case Type::unreachable:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  assert(type.isRef());
  auto heapType = type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic()) {
      case HeapType::i31:
        WASM_UNREACHABLE("TODO: i31");
      case HeapType::ext:
      case HeapType::any:
        WASM_UNREACHABLE("TODO: extern literals");
      case HeapType::eq:
      case HeapType::func:
      case HeapType::struct_:
      case HeapType::array:
        WASM_UNREACHABLE("invalid type");
      case HeapType::string:
      case HeapType::stringview_wtf8:
      case HeapType::stringview_wtf16:
      case HeapType::stringview_iter:
        WASM_UNREACHABLE("TODO: string literals");
      case HeapType::none:
      case HeapType::noext:
      case HeapType::nofunc:
        assert(type.isNullable());
        return Literal::makeNull(heapType);
    }
  }
  if (heapType.isSignature()) {
    return Literal::makeFunc(Name(x.func), heapType);
  }
  assert(heapType.isData());
  WASM_UNREACHABLE("TODO: gc data");
}